

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx.c
# Opt level: O0

void test_pfx_merge(void)

{
  pfx_table *old_table;
  int iVar1;
  long in_FS_OFFSET;
  undefined1 local_128 [8];
  pfx_table pfxt2;
  pfx_table pfxt1;
  pfx_record records [3];
  
  records[2].socket = *(rtr_socket **)(in_FS_OFFSET + 0x28);
  pfx_table_init((pfx_table *)((long)&pfxt2.lock + 0x30),(pfx_update_fp)0x0);
  pfx_table_init((pfx_table *)local_128,(pfx_update_fp)0x0);
  create_ip4_pfx_record((pfx_record *)((long)&pfxt1.lock + 0x30),1,"1.1.1.1",'\x18','\x18');
  create_ip4_pfx_record((pfx_record *)&records[0].socket,2,"2.2.2.2",'\x18','\x18');
  create_ip4_pfx_record((pfx_record *)&records[1].socket,3,"3.3.3.3",'\x18','\x18');
  printf("Adding to table one\n");
  iVar1 = pfx_table_add((pfx_table *)((long)&pfxt2.lock + 0x30),
                        (pfx_record *)((long)&pfxt1.lock + 0x30));
  if (iVar1 != 0) {
    __assert_fail("pfx_table_add(&pfxt1, &records[0]) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x1a5,"void test_pfx_merge(void)");
  }
  iVar1 = pfx_table_add((pfx_table *)((long)&pfxt2.lock + 0x30),(pfx_record *)&records[0].socket);
  if (iVar1 != 0) {
    __assert_fail("pfx_table_add(&pfxt1, &records[1]) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x1a6,"void test_pfx_merge(void)");
  }
  printf("Adding to table two\n");
  iVar1 = pfx_table_add((pfx_table *)local_128,(pfx_record *)&records[0].socket);
  if (iVar1 != 0) {
    __assert_fail("pfx_table_add(&pfxt2, &records[1]) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x1a8,"void test_pfx_merge(void)");
  }
  iVar1 = pfx_table_add((pfx_table *)local_128,(pfx_record *)&records[1].socket);
  if (iVar1 == 0) {
    printf("Computing diff\n");
    pfxt1.ipv6 = (trie_node *)update_cb1;
    pfxt2.ipv6 = (trie_node *)update_cb1;
    old_table = (pfx_table *)((long)&pfxt2.lock + 0x30);
    pfx_table_notify_diff((pfx_table *)local_128,old_table,(rtr_socket *)0x1);
    pfxt1.ipv6 = (trie_node *)0x0;
    pfxt2.ipv6 = (trie_node *)0x0;
    printf("Freeing table one\n");
    pfx_table_free(old_table);
    printf("Freeing table two\n");
    pfx_table_free((pfx_table *)local_128);
    if (*(rtr_socket **)(in_FS_OFFSET + 0x28) == records[2].socket) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("pfx_table_add(&pfxt2, &records[2]) == PFX_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                ,0x1a9,"void test_pfx_merge(void)");
}

Assistant:

static void test_pfx_merge(void)
{
	struct pfx_table pfxt1;
	struct pfx_table pfxt2;
	struct pfx_record records[3];

	pfx_table_init(&pfxt1, NULL);
	pfx_table_init(&pfxt2, NULL);

	create_ip4_pfx_record(&records[0], 1, "1.1.1.1", 24, 24);
	create_ip4_pfx_record(&records[1], 2, "2.2.2.2", 24, 24);
	create_ip4_pfx_record(&records[2], 3, "3.3.3.3", 24, 24);

	printf("Adding to table one\n");
	assert(pfx_table_add(&pfxt1, &records[0]) == PFX_SUCCESS);
	assert(pfx_table_add(&pfxt1, &records[1]) == PFX_SUCCESS);
	printf("Adding to table two\n");
	assert(pfx_table_add(&pfxt2, &records[1]) == PFX_SUCCESS);
	assert(pfx_table_add(&pfxt2, &records[2]) == PFX_SUCCESS);

	printf("Computing diff\n");
	pfxt1.update_fp = update_cb1;
	pfxt2.update_fp = update_cb1;
	pfx_table_notify_diff(&pfxt2, &pfxt1, (struct rtr_socket *)1);
	pfxt1.update_fp = NULL;
	pfxt2.update_fp = NULL;

	printf("Freeing table one\n");
	pfx_table_free(&pfxt1);
	printf("Freeing table two\n");
	pfx_table_free(&pfxt2);
}